

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::UncoreMinimize::handleModel(UncoreMinimize *this,Solver *s)

{
  uint32 uVar1;
  ulong uVar2;
  wsum_t wVar3;
  undefined8 in_RSI;
  SharedMinimizeData *in_RDI;
  UncoreMinimize *unaff_retaddr;
  SharedMinimizeData *in_stack_00000008;
  uint32 in_stack_ffffffffffffffdc;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  uVar2 = (*(code *)(in_RDI->adjust_).ebo_.buf[6])(in_RDI,in_RSI);
  if ((uVar2 & 1) == 0) {
    bVar4 = false;
  }
  else {
    if (*in_RDI->up_[1].ebo_.buf < 0) {
      computeSum(unaff_retaddr,
                 (Solver *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    SharedMinimizeData::setOptimum(in_stack_00000008,(wsum_t *)unaff_retaddr);
    bVar4 = SharedMinimizeData::checkNext(in_RDI);
    in_RDI[2].up_[0].ebo_.cap = in_RDI[2].up_[0].ebo_.cap & 0xefffffff | (uint)bVar4 << 0x1c;
    uVar1 = SharedMinimizeData::generation((SharedMinimizeData *)0x1b41ef);
    in_RDI[2].up_[0].ebo_.size = uVar1;
    wVar3 = SharedMinimizeData::upper(in_RDI,in_stack_ffffffffffffffdc);
    in_RDI[2].adjust_.ebo_.size = (int)wVar3;
    in_RDI[2].adjust_.ebo_.cap = (int)((ulong)wVar3 >> 0x20);
    if (((in_RDI[2].up_[0].ebo_.cap >> 0x1c & 1) != 0) &&
       ((in_RDI[2].up_[0].ebo_.cap >> 0x1d & 1) == 0)) {
      bVar4 = Todo::shrink((Todo *)(in_RDI + 1));
      if ((!bVar4) &&
         ((*(int *)((long)&in_RDI[2].up_[1].ebo_.buf + 4) == 0 &&
          (in_RDI[2].adjust_.ebo_.buf !=
           (pointer)in_RDI->up_[1].ebo_.buf[in_RDI[2].up_[0].ebo_.cap & 0xfffffff])))) {
        Potassco::fail(-1,"virtual bool Clasp::UncoreMinimize::handleModel(Solver &)",0x43e,
                       "!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_]",
                       "Unexpected lower bound on model!",0);
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool UncoreMinimize::handleModel(Solver& s) {
	if (!valid(s))  { return false; }
	if (sum_[0] < 0){ computeSum(s);}
	shared_->setOptimum(sum_);
	next_ = shared_->checkNext();
	gen_  = shared_->generation();
	upper_= shared_->upper(level_);
	POTASSCO_ASSERT(!next_ || disj_ || todo_.shrink() || nextW_ || lower_ == sum_[level_], "Unexpected lower bound on model!");
	return true;
}